

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::Version::~Version(Version *this)

{
  int iVar1;
  long lVar2;
  Version *pVVar3;
  FileMetaData *pFVar4;
  pointer pcVar5;
  void *pvVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer ppFVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->refs_ != 0) {
    __assert_fail("refs_ == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x45,"leveldb::Version::~Version()");
  }
  pVVar3 = this->prev_;
  pVVar3->next_ = this->next_;
  this->next_->prev_ = pVVar3;
  lVar10 = 0;
  do {
    ppFVar8 = this->files_[lVar10].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (this->files_[lVar10].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppFVar8) {
      uVar9 = 0;
      do {
        pFVar4 = ppFVar8[uVar9];
        iVar1 = pFVar4->refs;
        if (iVar1 < 1) {
          __assert_fail("f->refs > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                        ,0x4f,"leveldb::Version::~Version()");
        }
        pFVar4->refs = iVar1 + -1;
        if (iVar1 == 1) {
          pcVar5 = (pFVar4->largest).rep_._M_dataplus._M_p;
          paVar7 = &(pFVar4->largest).rep_.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != paVar7) {
            operator_delete(pcVar5,paVar7->_M_allocated_capacity + 1);
          }
          pcVar5 = (pFVar4->smallest).rep_._M_dataplus._M_p;
          paVar7 = &(pFVar4->smallest).rep_.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != paVar7) {
            operator_delete(pcVar5,paVar7->_M_allocated_capacity + 1);
          }
          operator_delete(pFVar4,0x58);
        }
        uVar9 = uVar9 + 1;
        ppFVar8 = this->files_[lVar10].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)this->files_[lVar10].
                                     super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8 >> 3
                              ));
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 7);
  lVar10 = 0xc0;
  do {
    pvVar6 = *(void **)((long)(this->files_ + -2) + lVar10);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,*(long *)((long)this->files_ + lVar10 + -0x20) - (long)pvVar6);
    }
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != 0x18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Version::~Version() {
  assert(refs_ == 0);

  // Remove from linked list
  prev_->next_ = next_;
  next_->prev_ = prev_;

  // Drop references to files
  for (int level = 0; level < config::kNumLevels; level++) {
    for (size_t i = 0; i < files_[level].size(); i++) {
      FileMetaData* f = files_[level][i];
      assert(f->refs > 0);
      f->refs--;
      if (f->refs <= 0) {
        delete f;
      }
    }
  }
}